

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.cpp
# Opt level: O2

Property * Assimp::FBX::anon_unknown_6::ReadTypedProperty(Element *element)

{
  int iVar1;
  pointer pcVar2;
  TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  undefined **ppuVar3;
  Token *in_RDX;
  Token *t;
  float fVar4;
  float fVar5;
  float fVar6;
  string local_50;
  string local_30;
  
  ParseTokenAsString_abi_cxx11_
            (&local_30,
             (FBX *)(element->tokens).
                    super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[1],in_RDX);
  iVar1 = strcmp(local_30._M_dataplus._M_p,"KString");
  if (iVar1 == 0) {
    this = (TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)operator_new(0x28);
    ParseTokenAsString_abi_cxx11_
              (&local_50,
               (FBX *)(element->tokens).
                      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[4],t);
    TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::TypedProperty(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    iVar1 = strcmp(local_30._M_dataplus._M_p,"bool");
    if (iVar1 != 0) {
      iVar1 = strcmp(local_30._M_dataplus._M_p,"Bool");
      if (iVar1 != 0) {
        iVar1 = strcmp(local_30._M_dataplus._M_p,"int");
        if (iVar1 != 0) {
          iVar1 = strcmp(local_30._M_dataplus._M_p,"Int");
          if (iVar1 != 0) {
            iVar1 = strcmp(local_30._M_dataplus._M_p,"enum");
            if (iVar1 != 0) {
              iVar1 = strcmp(local_30._M_dataplus._M_p,"Enum");
              if (iVar1 != 0) {
                iVar1 = strcmp(local_30._M_dataplus._M_p,"ULongLong");
                if (iVar1 == 0) {
                  this = (TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)operator_new(0x10);
                  pcVar2 = (pointer)ParseTokenAsID((element->tokens).
                                                                                                      
                                                  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[4]);
                  ppuVar3 = &PTR__Property_00245b08;
                }
                else {
                  iVar1 = strcmp(local_30._M_dataplus._M_p,"KTime");
                  if (iVar1 != 0) {
                    iVar1 = strcmp(local_30._M_dataplus._M_p,"Vector3D");
                    if (iVar1 != 0) {
                      iVar1 = strcmp(local_30._M_dataplus._M_p,"ColorRGB");
                      if (iVar1 != 0) {
                        iVar1 = strcmp(local_30._M_dataplus._M_p,"Vector");
                        if (iVar1 != 0) {
                          iVar1 = strcmp(local_30._M_dataplus._M_p,"Color");
                          if (iVar1 != 0) {
                            iVar1 = strcmp(local_30._M_dataplus._M_p,"Lcl Translation");
                            if (iVar1 != 0) {
                              iVar1 = strcmp(local_30._M_dataplus._M_p,"Lcl Rotation");
                              if (iVar1 != 0) {
                                iVar1 = strcmp(local_30._M_dataplus._M_p,"Lcl Scaling");
                                if (iVar1 != 0) {
                                  iVar1 = strcmp(local_30._M_dataplus._M_p,"double");
                                  if (iVar1 != 0) {
                                    iVar1 = strcmp(local_30._M_dataplus._M_p,"Number");
                                    if (iVar1 != 0) {
                                      iVar1 = strcmp(local_30._M_dataplus._M_p,"Float");
                                      if (iVar1 != 0) {
                                        iVar1 = strcmp(local_30._M_dataplus._M_p,"FieldOfView");
                                        if (iVar1 != 0) {
                                          iVar1 = strcmp(local_30._M_dataplus._M_p,"UnitScaleFactor"
                                                        );
                                          if (iVar1 != 0) {
                                            this = (
                                                  TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)0x0;
                                            goto LAB_0016f90b;
                                          }
                                        }
                                      }
                                    }
                                  }
                                  this = (TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)operator_new(0x10);
                                  fVar6 = ParseTokenAsFloat((element->tokens).
                                                                                                                        
                                                  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[4]);
                                  (this->super_Property)._vptr_Property =
                                       (_func_int **)&PTR__Property_00245b68;
                                  *(float *)&(this->value)._M_dataplus._M_p = fVar6;
                                  goto LAB_0016f90b;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    this = (TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)operator_new(0x18);
                    fVar6 = ParseTokenAsFloat((element->tokens).
                                              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start[4]);
                    fVar4 = ParseTokenAsFloat((element->tokens).
                                              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start[5]);
                    fVar5 = ParseTokenAsFloat((element->tokens).
                                              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start[6]);
                    (this->super_Property)._vptr_Property = (_func_int **)&PTR__Property_00245b48;
                    *(float *)&(this->value)._M_dataplus._M_p = fVar6;
                    *(float *)((long)&(this->value)._M_dataplus._M_p + 4) = fVar4;
                    *(float *)&(this->value)._M_string_length = fVar5;
                    goto LAB_0016f90b;
                  }
                  this = (TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)operator_new(0x10);
                  pcVar2 = (pointer)ParseTokenAsInt64((element->tokens).
                                                                                                            
                                                  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[4]);
                  ppuVar3 = &PTR__Property_00245b28;
                }
                (this->super_Property)._vptr_Property = (_func_int **)ppuVar3;
                (this->value)._M_dataplus._M_p = pcVar2;
                goto LAB_0016f90b;
              }
            }
          }
        }
        this = (TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)operator_new(0x10);
        iVar1 = ParseTokenAsInt((element->tokens).
                                super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[4]);
        (this->super_Property)._vptr_Property = (_func_int **)&PTR__Property_00245ae8;
        *(int *)&(this->value)._M_dataplus._M_p = iVar1;
        goto LAB_0016f90b;
      }
    }
    this = (TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)operator_new(0x10);
    iVar1 = ParseTokenAsInt((element->tokens).
                            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[4]);
    (this->super_Property)._vptr_Property = (_func_int **)&PTR__Property_00245ac8;
    *(bool *)&(this->value)._M_dataplus._M_p = iVar1 != 0;
  }
LAB_0016f90b:
  std::__cxx11::string::~string((string *)&local_30);
  return &this->super_Property;
}

Assistant:

Property* ReadTypedProperty(const Element& element)
{
    ai_assert(element.KeyToken().StringContents() == "P");

    const TokenList& tok = element.Tokens();
    ai_assert(tok.size() >= 5);

    const std::string& s = ParseTokenAsString(*tok[1]);
    const char* const cs = s.c_str();
    if (!strcmp(cs,"KString")) {
        return new TypedProperty<std::string>(ParseTokenAsString(*tok[4]));
    }
    else if (!strcmp(cs,"bool") || !strcmp(cs,"Bool")) {
        return new TypedProperty<bool>(ParseTokenAsInt(*tok[4]) != 0);
    }
    else if (!strcmp(cs, "int") || !strcmp(cs, "Int") || !strcmp(cs, "enum") || !strcmp(cs, "Enum")) {
        return new TypedProperty<int>(ParseTokenAsInt(*tok[4]));
    }
    else if (!strcmp(cs, "ULongLong")) {
        return new TypedProperty<uint64_t>(ParseTokenAsID(*tok[4]));
    }
    else if (!strcmp(cs, "KTime")) {
        return new TypedProperty<int64_t>(ParseTokenAsInt64(*tok[4]));
    }
    else if (!strcmp(cs,"Vector3D") ||
        !strcmp(cs,"ColorRGB") ||
        !strcmp(cs,"Vector") ||
        !strcmp(cs,"Color") ||
        !strcmp(cs,"Lcl Translation") ||
        !strcmp(cs,"Lcl Rotation") ||
        !strcmp(cs,"Lcl Scaling")
        ) {
        return new TypedProperty<aiVector3D>(aiVector3D(
            ParseTokenAsFloat(*tok[4]),
            ParseTokenAsFloat(*tok[5]),
            ParseTokenAsFloat(*tok[6]))
        );
    }
    else if (!strcmp(cs,"double") || !strcmp(cs,"Number") || !strcmp(cs,"Float") || !strcmp(cs,"FieldOfView") || !strcmp( cs, "UnitScaleFactor" ) ) {
        return new TypedProperty<float>(ParseTokenAsFloat(*tok[4]));
    }
    return NULL;
}